

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::AlternativePass0
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,int depth)

{
  EncodedChar EVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  do {
    if (this->inputLim < this->next) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    EVar1 = *this->next;
    if (EVar1 == '\0') {
      if (this->inputLim <= this->next) {
        return;
      }
    }
    else {
      if (EVar1 == ')') {
        return;
      }
      if (EVar1 == '|') {
        return;
      }
    }
    TermPass0(this,depth);
  } while( true );
}

Assistant:

void Parser<P, IsLiteral>::AlternativePass0(int depth)
    {
        while (!IsEndOfAlternative())
            TermPass0(depth);
    }